

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  ExprList *pEVar1;
  Bitmask BVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ExprList_item *pEVar8;
  
  if ((p->op == 0xa2) && ((p->flags & 8) == 0)) {
    if ((long)pMaskSet->n < 1) {
      return 0;
    }
    lVar6 = 0;
    do {
      if (pMaskSet->ix[lVar6] == p->iTable) {
        return 1L << ((byte)lVar6 & 0x3f);
      }
      lVar6 = lVar6 + 1;
    } while (pMaskSet->n != lVar6);
    return 0;
  }
  if ((p->flags & 0x804000) != 0) {
    return 0;
  }
  if ((p->op == 0xab) && (0 < (long)pMaskSet->n)) {
    uVar7 = 0;
    lVar6 = 0;
    do {
      if (pMaskSet->ix[lVar6] == p->iTable) {
        uVar7 = 1L << ((byte)lVar6 & 0x3f);
        break;
      }
      lVar6 = lVar6 + 1;
    } while (pMaskSet->n != lVar6);
  }
  else {
    uVar7 = 0;
  }
  if (p->pLeft != (Expr *)0x0) {
    BVar2 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
    uVar7 = uVar7 | BVar2;
  }
  if (p->pRight == (Expr *)0x0) {
    if ((p->flags >> 0xb & 1) == 0) {
      pEVar1 = (p->x).pList;
      if (pEVar1 != (ExprList *)0x0) {
        if (pEVar1->nExpr < 1) {
          uVar3 = 0;
        }
        else {
          pEVar8 = pEVar1->a;
          lVar6 = 0;
          uVar3 = 0;
          do {
            if (pEVar8->pExpr == (Expr *)0x0) {
              uVar4 = 0;
            }
            else {
              uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar8->pExpr);
            }
            uVar3 = uVar3 | uVar4;
            lVar6 = lVar6 + 1;
            pEVar8 = pEVar8 + 1;
          } while (lVar6 < pEVar1->nExpr);
        }
        uVar7 = uVar7 | uVar3;
      }
      goto LAB_0018b0bb;
    }
    if ((p->flags & 0x20) != 0) {
      pMaskSet->bVarSelect = 1;
    }
    uVar3 = exprSelectUsage(pMaskSet,(p->x).pSelect);
  }
  else {
    uVar3 = sqlite3WhereExprUsageNN(pMaskSet,p->pRight);
  }
  uVar7 = uVar7 | uVar3;
LAB_0018b0bb:
  if (p->op != 0xa1) {
    return uVar7;
  }
  if ((p->y).pWin != (Window *)0x0) {
    pEVar1 = ((p->y).pWin)->pPartition;
    if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
      uVar3 = 0;
    }
    else {
      pEVar8 = pEVar1->a;
      lVar6 = 0;
      uVar3 = 0;
      do {
        if (pEVar8->pExpr == (Expr *)0x0) {
          uVar4 = 0;
        }
        else {
          uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar8->pExpr);
        }
        uVar3 = uVar3 | uVar4;
        lVar6 = lVar6 + 1;
        pEVar8 = pEVar8 + 1;
      } while (lVar6 < pEVar1->nExpr);
    }
    pEVar1 = ((p->y).pWin)->pOrderBy;
    if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
      uVar4 = 0;
    }
    else {
      pEVar8 = pEVar1->a;
      lVar6 = 0;
      uVar4 = 0;
      do {
        if (pEVar8->pExpr == (Expr *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pEVar8->pExpr);
        }
        uVar4 = uVar4 | uVar5;
        lVar6 = lVar6 + 1;
        pEVar8 = pEVar8 + 1;
      } while (lVar6 < pEVar1->nExpr);
    }
    return uVar3 | uVar7 | uVar4;
  }
  return uVar7;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask;
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprHasProperty(p, EP_xIsSelect) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->op==TK_FUNCTION && p->y.pWin ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pPartition);
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pOrderBy);
  }
#endif
  return mask;
}